

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

quicly_stream_t * quicly_get_stream(quicly_conn_t *conn,quicly_stream_id_t stream_id)

{
  uint uVar1;
  kh_quicly_stream_t_t *pkVar2;
  quicly_stream_t *pqVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  pkVar2 = conn->streams;
  uVar1 = pkVar2->n_buckets;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar7 = ((uint)((ulong)stream_id >> 0x21) ^ (uint)stream_id << 0xb ^ (uint)stream_id) &
            uVar1 - 1;
    iVar8 = 1;
    uVar6 = uVar7;
    do {
      bVar4 = (char)uVar6 * '\x02' & 0x1e;
      uVar5 = pkVar2->flags[uVar6 >> 4] >> bVar4;
      if (((uVar5 & 2) != 0) || (((uVar5 & 1) == 0 && (pkVar2->keys[uVar6] == stream_id)))) {
        uVar5 = uVar6;
        if ((pkVar2->flags[uVar6 >> 4] >> bVar4 & 3) != 0) {
          uVar5 = uVar1;
        }
        break;
      }
      uVar6 = uVar6 + iVar8 & uVar1 - 1;
      iVar8 = iVar8 + 1;
      uVar5 = uVar1;
    } while (uVar6 != uVar7);
  }
  if (uVar5 == uVar1) {
    pqVar3 = (quicly_stream_t *)0x0;
  }
  else {
    pqVar3 = pkVar2->vals[uVar5];
  }
  return pqVar3;
}

Assistant:

quicly_stream_t *quicly_get_stream(quicly_conn_t *conn, quicly_stream_id_t stream_id)
{
    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream_id);
    if (iter != kh_end(conn->streams))
        return kh_val(conn->streams, iter);
    return NULL;
}